

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# policy.cpp
# Opt level: O0

CAmount GetDustThreshold(CTxOut *txout,CFeeRate *dustRelayFeeIn)

{
  long lVar1;
  bool bVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  long in_FS_OFFSET;
  size_t nSize;
  vector<unsigned_char,_std::allocator<unsigned_char>_> witnessprogram;
  int witnessversion;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffff88;
  CTxOut *in_stack_ffffffffffffff90;
  uint32_t num_bytes;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_ffffffffffffffd0;
  int *in_stack_ffffffffffffffd8;
  CScript *in_stack_ffffffffffffffe0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = CScript::IsUnspendable((CScript *)in_stack_ffffffffffffff90);
  if (bVar2) {
    this = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
  }
  else {
    GetSerializeSize<CTxOut>(in_stack_ffffffffffffff90);
    num_bytes = (uint32_t)((ulong)&stack0xffffffffffffffd8 >> 0x20);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(in_stack_ffffffffffffff88);
    bVar2 = CScript::IsWitnessProgram
                      (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0
                      );
    this = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
           CFeeRate::GetFee((CFeeRate *)
                            CONCAT44(in_stack_ffffffffffffffac,
                                     CONCAT13(bVar2,(int3)in_stack_ffffffffffffffa8)),num_bytes);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (CAmount)this;
  }
  __stack_chk_fail();
}

Assistant:

CAmount GetDustThreshold(const CTxOut& txout, const CFeeRate& dustRelayFeeIn)
{
    // "Dust" is defined in terms of dustRelayFee,
    // which has units satoshis-per-kilobyte.
    // If you'd pay more in fees than the value of the output
    // to spend something, then we consider it dust.
    // A typical spendable non-segwit txout is 34 bytes big, and will
    // need a CTxIn of at least 148 bytes to spend:
    // so dust is a spendable txout less than
    // 182*dustRelayFee/1000 (in satoshis).
    // 546 satoshis at the default rate of 3000 sat/kvB.
    // A typical spendable segwit P2WPKH txout is 31 bytes big, and will
    // need a CTxIn of at least 67 bytes to spend:
    // so dust is a spendable txout less than
    // 98*dustRelayFee/1000 (in satoshis).
    // 294 satoshis at the default rate of 3000 sat/kvB.
    if (txout.scriptPubKey.IsUnspendable())
        return 0;

    size_t nSize = GetSerializeSize(txout);
    int witnessversion = 0;
    std::vector<unsigned char> witnessprogram;

    // Note this computation is for spending a Segwit v0 P2WPKH output (a 33 bytes
    // public key + an ECDSA signature). For Segwit v1 Taproot outputs the minimum
    // satisfaction is lower (a single BIP340 signature) but this computation was
    // kept to not further reduce the dust level.
    // See discussion in https://github.com/bitcoin/bitcoin/pull/22779 for details.
    if (txout.scriptPubKey.IsWitnessProgram(witnessversion, witnessprogram)) {
        // sum the sizes of the parts of a transaction input
        // with 75% segwit discount applied to the script size.
        nSize += (32 + 4 + 1 + (107 / WITNESS_SCALE_FACTOR) + 4);
    } else {
        nSize += (32 + 4 + 1 + 107 + 4); // the 148 mentioned above
    }

    return dustRelayFeeIn.GetFee(nSize);
}